

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenSIMDShuffle(BinaryenModuleRef module,BinaryenExpressionRef left,BinaryenExpressionRef right,
                   uint8_t *mask_)

{
  SIMDShuffle *pSVar1;
  undefined1 auStack_28 [8];
  array<unsigned_char,_16UL> mask;
  Builder local_10;
  
  if (mask_ != (uint8_t *)0x0) {
    auStack_28 = *(undefined1 (*) [8])mask_;
    mask._M_elems._0_8_ = *(undefined8 *)(mask_ + 8);
    local_10.wasm = module;
    pSVar1 = wasm::Builder::makeSIMDShuffle
                       (&local_10,left,right,(array<unsigned_char,_16UL> *)auStack_28);
    return (BinaryenExpressionRef)pSVar1;
  }
  __assert_fail("mask_",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x5b3,
                "BinaryenExpressionRef BinaryenSIMDShuffle(BinaryenModuleRef, BinaryenExpressionRef, BinaryenExpressionRef, const uint8_t *)"
               );
}

Assistant:

BinaryenExpressionRef BinaryenSIMDShuffle(BinaryenModuleRef module,
                                          BinaryenExpressionRef left,
                                          BinaryenExpressionRef right,
                                          const uint8_t mask_[16]) {
  assert(mask_); // nullptr would be wrong
  std::array<uint8_t, 16> mask;
  memcpy(mask.data(), mask_, 16);
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeSIMDShuffle((Expression*)left, (Expression*)right, mask));
}